

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_conjunction.cpp
# Opt level: O3

idx_t __thiscall
duckdb::ExpressionExecutor::Select
          (ExpressionExecutor *this,BoundConjunctionExpression *expr,ExpressionState *state_p,
          SelectionVector *sel,idx_t count,SelectionVector *true_sel,SelectionVector *false_sel)

{
  ExpressionType EVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Head_base<0UL,_duckdb::SelectionVector_*,_false> _Var3;
  long lVar4;
  pointer pAVar5;
  SelectionVector *pSVar6;
  reference pvVar7;
  const_reference pvVar8;
  type pEVar9;
  reference pvVar10;
  idx_t iVar11;
  pointer pSVar12;
  ulong uVar13;
  idx_t iVar14;
  idx_t iVar15;
  ExpressionState *this_00;
  size_type sVar16;
  ulong uVar17;
  idx_t iVar18;
  _Head_base<0UL,_duckdb::SelectionVector_*,_false> local_90;
  _Head_base<0UL,_duckdb::SelectionVector_*,_false> local_88;
  idx_t local_80;
  SelectionVector *local_78;
  idx_t local_70;
  ExpressionState *local_68;
  ExpressionState *local_60;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_58;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_50;
  long local_48;
  BoundConjunctionExpression *local_40;
  ExpressionExecutor *local_38;
  
  EVar1 = (expr->super_Expression).super_BaseExpression.type;
  local_68 = state_p + 1;
  local_70 = count;
  local_60 = state_p;
  local_38 = this;
  pAVar5 = unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>::
           operator->((unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                       *)local_68);
  local_50.__d.__r = (duration)AdaptiveFilter::BeginFilter(pAVar5);
  this_00 = local_68;
  local_40 = expr;
  if (EVar1 == CONJUNCTION_AND) {
    local_88._M_head_impl = (SelectionVector *)0x0;
    local_90._M_head_impl = (SelectionVector *)0x0;
    local_78 = true_sel;
    if (false_sel != (SelectionVector *)0x0) {
      pSVar6 = (SelectionVector *)operator_new(0x18);
      SelectionVector::SelectionVector(pSVar6,0x800);
      ::std::__uniq_ptr_impl<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>
      ::reset((__uniq_ptr_impl<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>
               *)&local_90,pSVar6);
    }
    if (local_78 == (SelectionVector *)0x0) {
      pSVar6 = (SelectionVector *)operator_new(0x18);
      SelectionVector::SelectionVector(pSVar6,0x800);
      ::std::__uniq_ptr_impl<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>
      ::reset((__uniq_ptr_impl<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>
               *)&local_88,pSVar6);
      local_78 = local_88._M_head_impl;
    }
    iVar11 = local_70;
    if ((expr->children).
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (expr->children).
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_58 = &expr->children;
      local_60 = (ExpressionState *)&local_60->child_states;
      local_48 = 0;
      sVar16 = 0;
      iVar14 = local_70;
      do {
        pAVar5 = unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                 ::operator->((unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                               *)this_00);
        pvVar7 = vector<unsigned_long,_true>::operator[](&pAVar5->permutation,sVar16);
        pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](local_58,*pvVar7);
        pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(pvVar8);
        pAVar5 = unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                 ::operator->((unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                               *)this_00);
        pvVar7 = vector<unsigned_long,_true>::operator[](&pAVar5->permutation,sVar16);
        pvVar10 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
                                *)local_60,*pvVar7);
        iVar11 = Select(local_38,pEVar9,
                        (pvVar10->
                        super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
                        )._M_t.
                        super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
                        .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl,sel,
                        iVar14,local_78,local_90._M_head_impl);
        lVar4 = local_48;
        if ((false_sel != (SelectionVector *)0x0) && (iVar14 != iVar11)) {
          uVar17 = 0;
          local_80 = iVar11;
          do {
            pSVar12 = unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
                      ::operator->((unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
                                    *)&local_90);
            uVar13 = uVar17;
            if (pSVar12->sel_vector != (sel_t *)0x0) {
              uVar13 = (ulong)pSVar12->sel_vector[uVar17];
            }
            false_sel->sel_vector[lVar4 + uVar17] = (sel_t)uVar13;
            uVar17 = uVar17 + 1;
          } while (iVar14 - iVar11 != uVar17);
          local_48 = local_48 + uVar17;
          this_00 = local_68;
          iVar11 = local_80;
        }
        if (iVar11 == 0) {
          iVar11 = 0;
          break;
        }
        if (iVar11 < local_70) {
          sel = local_78;
        }
        sVar16 = sVar16 + 1;
        iVar14 = iVar11;
      } while (sVar16 < (ulong)((long)(local_40->children).
                                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                      .
                                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(local_40->children).
                                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                      .
                                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    pAVar5 = unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>::
             operator->((unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                         *)this_00);
    AdaptiveFilter::EndFilter(pAVar5,(AdaptiveFilterState)local_50.__d.__r);
    _Var3._M_head_impl = local_90._M_head_impl;
  }
  else {
    local_88._M_head_impl = (SelectionVector *)0x0;
    local_90._M_head_impl = (SelectionVector *)0x0;
    if (true_sel != (SelectionVector *)0x0) {
      pSVar6 = (SelectionVector *)operator_new(0x18);
      SelectionVector::SelectionVector(pSVar6,0x800);
      ::std::__uniq_ptr_impl<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>
      ::reset((__uniq_ptr_impl<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>
               *)&local_88,pSVar6);
    }
    if (false_sel == (SelectionVector *)0x0) {
      pSVar6 = (SelectionVector *)operator_new(0x18);
      SelectionVector::SelectionVector(pSVar6,0x800);
      ::std::__uniq_ptr_impl<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>
      ::reset((__uniq_ptr_impl<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>
               *)&local_90,pSVar6);
      false_sel = local_90._M_head_impl;
    }
    if ((expr->children).
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (expr->children).
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_80 = 0;
    }
    else {
      local_58 = &expr->children;
      local_60 = (ExpressionState *)&local_60->child_states;
      sVar16 = 0;
      local_80 = 0;
      local_78 = false_sel;
      do {
        pAVar5 = unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                 ::operator->((unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                               *)this_00);
        pvVar7 = vector<unsigned_long,_true>::operator[](&pAVar5->permutation,sVar16);
        pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](local_58,*pvVar7);
        pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(pvVar8);
        pAVar5 = unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                 ::operator->((unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                               *)this_00);
        pvVar7 = vector<unsigned_long,_true>::operator[](&pAVar5->permutation,sVar16);
        pvVar10 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
                                *)local_60,*pvVar7);
        iVar14 = Select(local_38,pEVar9,
                        (pvVar10->
                        super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
                        )._M_t.
                        super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
                        .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl,sel,
                        local_70,local_88._M_head_impl,local_78);
        iVar11 = local_80;
        if (iVar14 != 0) {
          if (true_sel != (SelectionVector *)0x0) {
            iVar18 = 0;
            do {
              pSVar12 = unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
                        ::operator->((unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
                                      *)&local_88);
              iVar15 = iVar18;
              if (pSVar12->sel_vector != (sel_t *)0x0) {
                iVar15 = (idx_t)pSVar12->sel_vector[iVar18];
              }
              true_sel->sel_vector[iVar11 + iVar18] = (sel_t)iVar15;
              iVar18 = iVar18 + 1;
            } while (iVar14 != iVar18);
            local_80 = local_80 + iVar18;
            this_00 = local_68;
          }
          local_70 = local_70 - iVar14;
          sel = local_78;
        }
        sVar16 = sVar16 + 1;
      } while (sVar16 < (ulong)((long)(local_40->children).
                                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                      .
                                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(local_40->children).
                                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                      .
                                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    if (true_sel != (SelectionVector *)0x0) {
      SelectionVector::Sort(true_sel,local_80);
    }
    pAVar5 = unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>::
             operator->((unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                         *)this_00);
    AdaptiveFilter::EndFilter(pAVar5,(AdaptiveFilterState)local_50.__d.__r);
    _Var3._M_head_impl = local_90._M_head_impl;
    iVar11 = local_80;
  }
  local_90._M_head_impl = _Var3._M_head_impl;
  if (_Var3._M_head_impl != (SelectionVector *)0x0) {
    p_Var2 = ((_Var3._M_head_impl)->selection_data).internal.
             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    operator_delete(_Var3._M_head_impl);
  }
  _Var3._M_head_impl = local_88._M_head_impl;
  if (local_88._M_head_impl != (SelectionVector *)0x0) {
    p_Var2 = ((local_88._M_head_impl)->selection_data).internal.
             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    operator_delete(_Var3._M_head_impl);
  }
  return iVar11;
}

Assistant:

idx_t ExpressionExecutor::Select(const BoundConjunctionExpression &expr, ExpressionState *state_p,
                                 const SelectionVector *sel, idx_t count, SelectionVector *true_sel,
                                 SelectionVector *false_sel) {
	auto &state = state_p->Cast<ConjunctionState>();

	if (expr.GetExpressionType() == ExpressionType::CONJUNCTION_AND) {
		// get runtime statistics
		auto filter_state = state.adaptive_filter->BeginFilter();
		const SelectionVector *current_sel = sel;
		idx_t current_count = count;
		idx_t false_count = 0;

		unique_ptr<SelectionVector> temp_true, temp_false;
		if (false_sel) {
			temp_false = make_uniq<SelectionVector>(STANDARD_VECTOR_SIZE);
		}
		if (!true_sel) {
			temp_true = make_uniq<SelectionVector>(STANDARD_VECTOR_SIZE);
			true_sel = temp_true.get();
		}
		for (idx_t i = 0; i < expr.children.size(); i++) {
			idx_t tcount = Select(*expr.children[state.adaptive_filter->permutation[i]],
			                      state.child_states[state.adaptive_filter->permutation[i]].get(), current_sel,
			                      current_count, true_sel, temp_false.get());
			idx_t fcount = current_count - tcount;
			if (fcount > 0 && false_sel) {
				// move failing tuples into the false_sel
				// tuples passed, move them into the actual result vector
				for (idx_t i = 0; i < fcount; i++) {
					false_sel->set_index(false_count++, temp_false->get_index(i));
				}
			}
			current_count = tcount;
			if (current_count == 0) {
				break;
			}
			if (current_count < count) {
				// tuples were filtered out: move on to using the true_sel to only evaluate passing tuples in subsequent
				// iterations
				current_sel = true_sel;
			}
		}
		// adapt runtime statistics
		state.adaptive_filter->EndFilter(filter_state);
		return current_count;
	} else {
		// get runtime statistics
		auto filter_state = state.adaptive_filter->BeginFilter();

		const SelectionVector *current_sel = sel;
		idx_t current_count = count;
		idx_t result_count = 0;

		unique_ptr<SelectionVector> temp_true, temp_false;
		if (true_sel) {
			temp_true = make_uniq<SelectionVector>(STANDARD_VECTOR_SIZE);
		}
		if (!false_sel) {
			temp_false = make_uniq<SelectionVector>(STANDARD_VECTOR_SIZE);
			false_sel = temp_false.get();
		}
		for (idx_t i = 0; i < expr.children.size(); i++) {
			idx_t tcount = Select(*expr.children[state.adaptive_filter->permutation[i]],
			                      state.child_states[state.adaptive_filter->permutation[i]].get(), current_sel,
			                      current_count, temp_true.get(), false_sel);
			if (tcount > 0) {
				if (true_sel) {
					// tuples passed, move them into the actual result vector
					for (idx_t i = 0; i < tcount; i++) {
						true_sel->set_index(result_count++, temp_true->get_index(i));
					}
				}
				// now move on to check only the non-passing tuples
				current_count -= tcount;
				current_sel = false_sel;
			}
		}
		if (true_sel) {
			true_sel->Sort(result_count);
		}

		// adapt runtime statistics
		state.adaptive_filter->EndFilter(filter_state);
		return result_count;
	}
}